

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackboard.h
# Opt level: O2

TypedData * blackboard_get(Blackboard *b,int id)

{
  iterator __position;
  _Base_ptr p_Var1;
  int local_1c;
  
  if (b == (Blackboard *)0x0) {
    p_Var1 = (_Base_ptr)0x0;
  }
  else {
    local_1c = id;
    std::mutex::lock(&b->bb_mutex);
    __position = std::
                 _Rb_tree<int,_std::pair<const_int,_TypedData_*>,_std::_Select1st<std::pair<const_int,_TypedData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
                 ::find(&(b->values)._M_t,&local_1c);
    if ((_Rb_tree_header *)__position._M_node == &(b->values)._M_t._M_impl.super__Rb_tree_header) {
      p_Var1 = (_Base_ptr)0x0;
    }
    else {
      p_Var1 = __position._M_node[1]._M_parent;
      std::
      _Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
                          *)&b->values,__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)b);
  }
  return (TypedData *)p_Var1;
}

Assistant:

TypedData* blackboard_get(Blackboard* b, int id)
{
    if (!b)
        return 0;

    std::lock_guard<std::mutex> lock(b->bb_mutex);
    auto it = b->values.find(id);
    if (it == b->values.end())
        return {};

    auto r = it->second;
    b->values.erase(it);
    return r;
}